

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-death-test.cc
# Opt level: O2

TestRole __thiscall testing::internal::NoExecDeathTest::AssumeRole(NoExecDeathTest *this)

{
  int iVar1;
  __pid_t _Var2;
  size_t sVar3;
  int *piVar4;
  UnitTestImpl *pUVar5;
  undefined8 extraout_RAX;
  TestRole TVar6;
  char *pcVar7;
  ostream *poVar8;
  long in_FS_OFFSET;
  int local_138;
  allocator<char> local_131;
  string local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  int pipe_fd [2];
  string local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  sVar3 = GetThreadCount();
  if (sVar3 != 1) {
    GTestLog::GTestLog((GTestLog *)&local_90,GTEST_WARNING,
                       "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/googletest/googletest/src/gtest-death-test.cc"
                       ,0x41a);
    Message::Message((Message *)&local_70);
    poVar8 = (ostream *)(local_70._M_dataplus._M_p + 0x10);
    std::operator<<(poVar8,"Death tests use fork(), which is unsafe particularly");
    std::operator<<(poVar8," in a threaded context. For this test, ");
    std::operator<<((ostream *)(local_70._M_dataplus._M_p + 0x10),"Google Test");
    std::operator<<((ostream *)(local_70._M_dataplus._M_p + 0x10)," ");
    poVar8 = (ostream *)(local_70._M_dataplus._M_p + 0x10);
    if (sVar3 == 0) {
      pcVar7 = "couldn\'t detect the number of threads.";
    }
    else {
      std::operator<<(poVar8,"detected ");
      std::ostream::_M_insert<unsigned_long>((ulong)(local_70._M_dataplus._M_p + 0x10));
      poVar8 = (ostream *)(local_70._M_dataplus._M_p + 0x10);
      pcVar7 = " threads.";
    }
    std::operator<<(poVar8,pcVar7);
    std::operator<<((ostream *)(local_70._M_dataplus._M_p + 0x10),
                    " See https://github.com/google/googletest/blob/master/googletest/docs/advanced.md#death-tests-and-threads"
                   );
    std::operator<<((ostream *)(local_70._M_dataplus._M_p + 0x10),
                    " for more explanation and suggested solutions, especially if");
    std::operator<<((ostream *)(local_70._M_dataplus._M_p + 0x10),
                    " this is the last message you see before your test times out.");
    StringStreamToString(&local_48,(stringstream *)local_70._M_dataplus._M_p);
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_70);
    std::operator<<((ostream *)&std::cerr,(string *)&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    GTestLog::~GTestLog((GTestLog *)&local_90);
  }
  iVar1 = pipe(pipe_fd);
  if (iVar1 == -1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_f0,"CHECK failed: File ",(allocator<char> *)&local_138);
    std::operator+(&local_d0,&local_f0,
                   "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/googletest/googletest/src/gtest-death-test.cc"
                  );
    std::operator+(&local_b0,&local_d0,", line ");
    local_130._M_dataplus._M_p._0_4_ = 0x41e;
    StreamableToString<int>(&local_110,(int *)&local_130);
    std::operator+(&local_90,&local_b0,&local_110);
    std::operator+(&local_70,&local_90,": ");
    std::operator+(&local_48,&local_70,"pipe(pipe_fd) != -1");
    if (*(long *)(in_FS_OFFSET + 0x28) != local_28) goto LAB_001559ec;
    DeathTestAbort(&local_48);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_48,"",(allocator<char> *)&local_70);
    DeathTest::set_last_death_test_message(&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    CaptureStderr();
    FlushInfoLog();
    _Var2 = fork();
    if (_Var2 != -1) {
      *(__pid_t *)&(this->super_ForkingDeathTest).super_DeathTestImpl.field_0x2c = _Var2;
      if (_Var2 == 0) {
        TVar6 = EXECUTE_TEST;
        do {
          iVar1 = close(pipe_fd[0]);
          if (iVar1 != -1) goto LAB_0015568d;
          piVar4 = __errno_location();
        } while (*piVar4 == 4);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_110,"CHECK failed: File ",&local_131);
        std::operator+(&local_f0,&local_110,
                       "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/googletest/googletest/src/gtest-death-test.cc"
                      );
        std::operator+(&local_d0,&local_f0,", line ");
        local_138 = 0x42f;
        StreamableToString<int>(&local_130,&local_138);
        std::operator+(&local_b0,&local_d0,&local_130);
        std::operator+(&local_90,&local_b0,": ");
        std::operator+(&local_70,&local_90,"close(pipe_fd[0])");
        std::operator+(&local_48,&local_70," != -1");
        if (*(long *)(in_FS_OFFSET + 0x28) != local_28) goto LAB_001559ec;
        DeathTestAbort(&local_48);
LAB_0015568d:
        (this->super_ForkingDeathTest).super_DeathTestImpl.write_fd_ = pipe_fd[1];
        pUVar5 = GetUnitTestImpl();
        ((pUVar5->listeners_).repeater_)->forwarding_enabled_ = false;
        g_in_fast_death_test_child = 1;
      }
      else {
        do {
          iVar1 = close(pipe_fd[1]);
          if (iVar1 != -1) goto LAB_00155572;
          piVar4 = __errno_location();
        } while (*piVar4 == 4);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_110,"CHECK failed: File ",&local_131);
        std::operator+(&local_f0,&local_110,
                       "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/googletest/googletest/src/gtest-death-test.cc"
                      );
        std::operator+(&local_d0,&local_f0,", line ");
        local_138 = 0x43b;
        StreamableToString<int>(&local_130,&local_138);
        std::operator+(&local_b0,&local_d0,&local_130);
        std::operator+(&local_90,&local_b0,": ");
        std::operator+(&local_70,&local_90,"close(pipe_fd[1])");
        std::operator+(&local_48,&local_70," != -1");
        if (*(long *)(in_FS_OFFSET + 0x28) != local_28) goto LAB_001559ec;
        DeathTestAbort(&local_48);
LAB_00155572:
        (this->super_ForkingDeathTest).super_DeathTestImpl.read_fd_ = pipe_fd[0];
        (this->super_ForkingDeathTest).super_DeathTestImpl.spawned_ = true;
        TVar6 = OVERSEE_TEST;
      }
      if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
        return TVar6;
      }
      goto LAB_001559ec;
    }
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_f0,"CHECK failed: File ",(allocator<char> *)&local_138);
  std::operator+(&local_d0,&local_f0,
                 "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/googletest/googletest/src/gtest-death-test.cc"
                );
  std::operator+(&local_b0,&local_d0,", line ");
  local_130._M_dataplus._M_p._0_4_ = 0x42c;
  StreamableToString<int>(&local_110,(int *)&local_130);
  std::operator+(&local_90,&local_b0,&local_110);
  std::operator+(&local_70,&local_90,": ");
  std::operator+(&local_48,&local_70,"child_pid != -1");
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    DeathTestAbort(&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_110);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_d0);
    std::__cxx11::string::~string((string *)&local_f0);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
      _Unwind_Resume(extraout_RAX);
    }
  }
LAB_001559ec:
  __stack_chk_fail();
}

Assistant:

DeathTest::TestRole NoExecDeathTest::AssumeRole() {
  const size_t thread_count = GetThreadCount();
  if (thread_count != 1) {
    GTEST_LOG_(WARNING) << DeathTestThreadWarning(thread_count);
  }

  int pipe_fd[2];
  GTEST_DEATH_TEST_CHECK_(pipe(pipe_fd) != -1);

  DeathTest::set_last_death_test_message("");
  CaptureStderr();
  // When we fork the process below, the log file buffers are copied, but the
  // file descriptors are shared.  We flush all log files here so that closing
  // the file descriptors in the child process doesn't throw off the
  // synchronization between descriptors and buffers in the parent process.
  // This is as close to the fork as possible to avoid a race condition in case
  // there are multiple threads running before the death test, and another
  // thread writes to the log file.
  FlushInfoLog();

  const pid_t child_pid = fork();
  GTEST_DEATH_TEST_CHECK_(child_pid != -1);
  set_child_pid(child_pid);
  if (child_pid == 0) {
    GTEST_DEATH_TEST_CHECK_SYSCALL_(close(pipe_fd[0]));
    set_write_fd(pipe_fd[1]);
    // Redirects all logging to stderr in the child process to prevent
    // concurrent writes to the log files.  We capture stderr in the parent
    // process and append the child process' output to a log.
    LogToStderr();
    // Event forwarding to the listeners of event listener API mush be shut
    // down in death test subprocesses.
    GetUnitTestImpl()->listeners()->SuppressEventForwarding();
    g_in_fast_death_test_child = true;
    return EXECUTE_TEST;
  } else {
    GTEST_DEATH_TEST_CHECK_SYSCALL_(close(pipe_fd[1]));
    set_read_fd(pipe_fd[0]);
    set_spawned(true);
    return OVERSEE_TEST;
  }
}